

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t validation_layer::zeEventDestroy(ze_event_handle_t hEvent)

{
  code *pcVar1;
  ze_result_t zVar2;
  ze_result_t result_00;
  element_type *this;
  size_type sVar3;
  reference ppvVar4;
  pointer this_00;
  size_type sStack_80;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t driver_result;
  ze_result_t result_1;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  ze_pfnEventDestroy_t pfnDestroy;
  allocator local_39;
  string local_38 [32];
  ze_event_handle_t local_18;
  ze_event_handle_t hEvent_local;
  
  local_18 = hEvent;
  this = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"zeEventDestroy(hEvent)",&local_39);
  loader::Logger::log_trace(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = *(code **)(context + 0x4a8);
  if (pcVar1 == (code *)0x0) {
    hEvent_local._4_4_ = logAndPropagateResult("zeEventDestroy",ZE_RESULT_ERROR_UNSUPPORTED_FEATURE)
    ;
  }
  else {
    sVar3 = std::
            vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
            ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                    *)(context + 0xd30));
    for (_result_1 = 0; _result_1 < sVar3; _result_1 = _result_1 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),_result_1);
      zVar2 = (*(*ppvVar4)->zeValidation->_vptr_ZEValidationEntryPoints[0x7e])
                        ((*ppvVar4)->zeValidation,local_18);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeEventDestroy",zVar2);
        return zVar2;
      }
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      this_00 = std::
                unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                              *)(context + 0xd48));
      zVar2 = ZEHandleLifetimeValidation::zeEventDestroyPrologue
                        (&this_00->zeHandleLifetime,local_18);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeEventDestroy",zVar2);
        return zVar2;
      }
    }
    zVar2 = (*pcVar1)(local_18);
    for (sStack_80 = 0; sStack_80 < sVar3; sStack_80 = sStack_80 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_80);
      result_00 = (*(*ppvVar4)->zeValidation->_vptr_ZEValidationEntryPoints[0x7f])
                            ((*ppvVar4)->zeValidation,local_18,(ulong)zVar2);
      if (result_00 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeEventDestroy",result_00);
        return zVar2;
      }
    }
    hEvent_local._4_4_ = logAndPropagateResult("zeEventDestroy",zVar2);
  }
  return hEvent_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventDestroy(
        ze_event_handle_t hEvent                        ///< [in][release] handle of event object to destroy
        )
    {
        context.logger->log_trace("zeEventDestroy(hEvent)");

        auto pfnDestroy = context.zeDdiTable.Event.pfnDestroy;

        if( nullptr == pfnDestroy )
            return logAndPropagateResult("zeEventDestroy", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventDestroyPrologue( hEvent );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventDestroy", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeEventDestroyPrologue( hEvent );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventDestroy", result);
        }

        auto driver_result = pfnDestroy( hEvent );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventDestroyEpilogue( hEvent ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventDestroy", result);
        }

        return logAndPropagateResult("zeEventDestroy", driver_result);
    }